

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O3

size_t BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                 int *dist_cache,HasherHandle hasher,ZopfliNode *nodes)

{
  undefined1 auVar1 [16];
  MemoryManager *m_00;
  undefined4 uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint8_t *puVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  uint8_t *puVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ZopfliNode *nodes_00;
  BackwardMatch *local_19b8;
  ulong local_19b0;
  ulong local_19a8;
  ulong local_1998;
  ulong local_1988;
  ulong local_1968;
  long local_1958;
  long local_1930;
  undefined8 local_1908;
  BrotliEncoderDictionary *local_1900;
  uint32_t local_18f8 [38];
  StartPosQueue queue;
  BackwardMatch matches [384];
  ZopfliCostModel local_b58;
  
  uVar8 = 0x145;
  if (params->quality < 0xb) {
    uVar8 = 0x96;
  }
  lVar12 = 0;
  if (0x7e < num_bytes) {
    lVar12 = num_bytes - 0x7f;
  }
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  local_1908 = m;
  InitZopfliCostModel(m,&local_b58,&params->dist,num_bytes);
  ZopfliCostModelSetFromLiteralCosts(&local_b58,position,ringbuffer,ringbuffer_mask);
  queue.idx_ = 0;
  if (3 < num_bytes) {
    local_1900 = &params->dictionary;
    sVar7 = 0;
    do {
      auVar1 = _DAT_00132090;
      uVar17 = sVar7 + position;
      sVar16 = max_backward_limit;
      if (uVar17 < max_backward_limit) {
        sVar16 = uVar17;
      }
      uVar24 = num_bytes - sVar7;
      uVar4 = uVar17 & ringbuffer_mask;
      uVar5 = 0x10;
      if (params->quality == 0xb) {
        uVar5 = 0x40;
      }
      uVar18 = 0;
      if (uVar5 <= uVar17) {
        uVar18 = uVar17 - uVar5;
      }
      uVar5 = (sVar7 - 1) + position;
      uVar23 = 1;
      local_19b8 = matches;
      if (uVar18 < uVar5) {
        puVar13 = ringbuffer + uVar4;
        uVar19 = (ulong)((uint)uVar24 & 7);
        local_19b8 = matches;
        while (uVar17 - uVar5 <= sVar16) {
          uVar20 = uVar5 & ringbuffer_mask;
          if ((*puVar13 == ringbuffer[uVar20]) && (puVar13[1] == ringbuffer[uVar20 + 1])) {
            if (7 < uVar24) {
              lVar25 = 0;
              uVar14 = 0;
LAB_0010b5f6:
              if (*(ulong *)(puVar13 + uVar14 * 8) == *(ulong *)(ringbuffer + uVar14 * 8 + uVar20))
              goto code_r0x0010b603;
              uVar14 = *(ulong *)(ringbuffer + uVar14 * 8 + uVar20) ^
                       *(ulong *)(puVar13 + uVar14 * 8);
              uVar20 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar14 = (uVar20 >> 3 & 0x1fffffff) - lVar25;
              goto LAB_0010b638;
            }
            uVar15 = 0;
            puVar26 = puVar13;
LAB_0010b676:
            uVar14 = uVar15;
            if (uVar19 != 0) {
              uVar21 = uVar19 | uVar15;
              uVar22 = uVar19;
              do {
                uVar14 = uVar15;
                if (ringbuffer[uVar15 + uVar20] != *puVar26) break;
                puVar26 = puVar26 + 1;
                uVar15 = uVar15 + 1;
                uVar22 = uVar22 - 1;
                uVar14 = uVar21;
              } while (uVar22 != 0);
            }
LAB_0010b638:
            if (uVar23 < uVar14) {
              local_19b8->distance = (uint32_t)(uVar17 - uVar5);
              local_19b8->length_and_code = (int)uVar14 << 5;
              local_19b8 = local_19b8 + 1;
              uVar23 = uVar14;
            }
          }
          uVar5 = uVar5 - 1;
          if ((uVar5 <= uVar18) || (2 < uVar23)) break;
        }
      }
      if (uVar23 < uVar24) {
        uVar18 = (ulong)((uint)(*(int *)(ringbuffer + uVar4) * 0x1e35a7bd) >> 0xf);
        uVar19 = (ulong)*(uint *)(hasher + uVar18 * 4 + 0x30);
        uVar5 = uVar24;
        if (0x7f < uVar24) {
          *(int *)(hasher + uVar18 * 4 + 0x30) = (int)uVar17;
          uVar5 = 0x80;
        }
        uVar18 = *(ulong *)(hasher + 0x28);
        local_1930 = (uVar18 & uVar17) * 2 + 1;
        local_1958 = (uVar18 & uVar17) * 2;
        if (uVar17 != uVar19) {
          lVar25 = 0x40;
          local_1968 = 0;
          local_1998 = 0;
LAB_0010bf66:
          bVar27 = lVar25 != 0;
          lVar25 = lVar25 + -1;
          if ((uVar17 - uVar19 <= sVar16) && (bVar27)) {
            uVar20 = local_1968;
            if (local_1998 < local_1968) {
              uVar20 = local_1998;
            }
            puVar13 = ringbuffer + uVar20 + (uVar19 & ringbuffer_mask);
            uVar14 = uVar24 - uVar20;
            if (7 < uVar14) {
              uVar22 = uVar14 & 0xfffffffffffffff8;
              lVar10 = 0;
              uVar15 = 0;
LAB_0010bfd4:
              if (*(ulong *)(puVar13 + uVar15 * 8) ==
                  *(ulong *)(ringbuffer + uVar15 * 8 + uVar20 + uVar4)) goto code_r0x0010bfe2;
              uVar15 = *(ulong *)(ringbuffer + uVar15 * 8 + uVar20 + uVar4) ^
                       *(ulong *)(puVar13 + uVar15 * 8);
              uVar14 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar15 = (uVar14 >> 3 & 0x1fffffff) - lVar10;
              goto LAB_0010c01e;
            }
            uVar22 = 0;
            goto LAB_0010c0fd;
          }
        }
LAB_0010b715:
        if (0x7f < uVar24) {
          uVar2 = *(undefined4 *)(hasher + 0x80030);
          *(undefined4 *)(hasher + local_1958 * 4 + 0x80038) = uVar2;
LAB_0010b732:
          *(undefined4 *)(hasher + local_1930 * 4 + 0x80038) = uVar2;
        }
      }
LAB_0010b742:
      lVar25 = 3;
      auVar28 = _DAT_00132080;
      auVar29 = _DAT_00132070;
      do {
        auVar30 = auVar28 ^ auVar1;
        if (auVar30._4_4_ == -0x80000000 && auVar30._0_4_ < -0x7fffffda) {
          *(undefined4 *)((long)&local_1908 + lVar25 * 4 + 4) = 0xfffffff;
          local_18f8[lVar25 + -2] = 0xfffffff;
        }
        auVar30 = auVar29 ^ auVar1;
        if (auVar30._4_4_ == -0x80000000 && auVar30._0_4_ < -0x7fffffda) {
          local_18f8[lVar25 + -1] = 0xfffffff;
          local_18f8[lVar25] = 0xfffffff;
        }
        lVar10 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 4;
        auVar28._8_8_ = lVar10 + 4;
        lVar10 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + 4;
        auVar29._8_8_ = lVar10 + 4;
        lVar25 = lVar25 + 4;
      } while (lVar25 != 0x2b);
      uVar23 = uVar23 + 1;
      if (uVar23 < 5) {
        uVar23 = 4;
      }
      nodes_00 = (ZopfliNode *)0x10b82d;
      iVar3 = BrotliFindAllStaticDictionaryMatches
                        (local_1900,ringbuffer + uVar4,uVar23,uVar24,local_18f8);
      if (iVar3 != 0) {
        if (0x24 < uVar24) {
          uVar24 = 0x25;
        }
        if (uVar23 <= uVar24) {
          iVar3 = (int)uVar23 << 5;
          do {
            uVar9 = local_18f8[uVar23];
            if ((uVar9 < 0xfffffff) &&
               (uVar4 = (ulong)(uVar9 >> 5) + sVar16 + 1, uVar4 <= (params->dist).max_distance)) {
              uVar9 = uVar9 & 0x1f;
              local_19b8->distance = (uint32_t)uVar4;
              if (uVar23 == uVar9) {
                uVar9 = 0;
              }
              local_19b8->length_and_code = uVar9 + iVar3;
              local_19b8 = local_19b8 + 1;
            }
            uVar23 = uVar23 + 1;
            iVar3 = iVar3 + 0x20;
          } while (uVar24 + 1 != uVar23);
        }
      }
      if ((long)local_19b8 - (long)matches == 0) {
        sVar16 = 0;
      }
      else {
        sVar16 = (long)local_19b8 - (long)matches >> 3;
        if (uVar8 < local_19b8[-1].length_and_code >> 5) {
          matches[0] = matches[sVar16 - 1];
          sVar16 = 1;
        }
      }
      sVar6 = UpdateNodes(num_bytes,position,sVar7,ringbuffer,ringbuffer_mask,params,
                          max_backward_limit,dist_cache,sVar16,matches,&local_b58,&queue,nodes);
      uVar4 = 0;
      if (0x3fff < sVar6) {
        uVar4 = sVar6;
      }
      if (sVar16 == 1) {
        uVar9 = matches[0].length_and_code >> 5;
        if ((uVar8 < uVar9) && (uVar4 < uVar9)) {
          uVar4 = (ulong)uVar9;
        }
      }
      if (1 < uVar4) {
        uVar5 = uVar17 + 1;
        uVar24 = uVar4 + uVar17;
        if (lVar12 + position <= uVar4 + uVar17) {
          uVar24 = lVar12 + position;
        }
        uVar18 = uVar24 - 0x3f;
        if (uVar24 < uVar17 + 0x40) {
          uVar18 = uVar5;
        }
        if ((uVar17 + 0x201 <= uVar18) && (uVar5 < uVar18)) {
          uVar17 = *(ulong *)(hasher + 0x28);
          do {
            uVar19 = uVar5 & ringbuffer_mask;
            uVar23 = (ulong)((uint)(*(int *)(ringbuffer + uVar19) * 0x1e35a7bd) >> 0xf);
            uVar20 = (ulong)*(uint *)(hasher + uVar23 * 4 + 0x30);
            local_19b0 = (uVar17 & uVar5) * 2 + 1;
            local_19a8 = (uVar17 & uVar5) * 2;
            *(int *)(hasher + uVar23 * 4 + 0x30) = (int)uVar5;
            if (uVar5 != uVar20) {
              lVar25 = 0x40;
              uVar23 = 0;
              local_1988 = 0;
LAB_0010bad6:
              bVar27 = lVar25 != 0;
              lVar25 = lVar25 + -1;
              if ((uVar5 - uVar20 <= uVar17 - 0xf) && (bVar27)) {
                uVar14 = uVar23;
                if (local_1988 < uVar23) {
                  uVar14 = local_1988;
                }
                puVar13 = ringbuffer + uVar14 + (uVar20 & ringbuffer_mask);
                uVar15 = 0x80 - uVar14;
                if (7 < uVar15) {
                  uVar22 = uVar15 & 0xfffffffffffffff8;
                  lVar10 = 0;
                  uVar21 = 0;
LAB_0010bb41:
                  if (*(ulong *)(puVar13 + uVar21 * 8) ==
                      *(ulong *)(ringbuffer + uVar21 * 8 + uVar14 + uVar19)) goto code_r0x0010bb4e;
                  uVar22 = *(ulong *)(ringbuffer + uVar21 * 8 + uVar14 + uVar19) ^
                           *(ulong *)(puVar13 + uVar21 * 8);
                  uVar15 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  uVar21 = (uVar15 >> 3 & 0x1fffffff) - lVar10;
                  goto LAB_0010bb8b;
                }
                uVar22 = 0;
                goto LAB_0010bc09;
              }
            }
LAB_0010ba87:
            uVar2 = *(undefined4 *)(hasher + 0x80030);
            *(undefined4 *)(hasher + local_19a8 * 4 + 0x80038) = uVar2;
LAB_0010ba9b:
            *(undefined4 *)(hasher + local_19b0 * 4 + 0x80038) = uVar2;
            uVar5 = uVar5 + 8;
          } while (uVar5 < uVar18);
        }
        if (uVar18 < uVar24) {
          uVar17 = *(ulong *)(hasher + 0x28);
          do {
            uVar19 = uVar18 & ringbuffer_mask;
            uVar5 = (ulong)((uint)(*(int *)(ringbuffer + uVar19) * 0x1e35a7bd) >> 0xf);
            uVar23 = (ulong)*(uint *)(hasher + uVar5 * 4 + 0x30);
            local_19b0 = (uVar17 & uVar18) * 2 + 1;
            local_19a8 = (uVar17 & uVar18) * 2;
            *(int *)(hasher + uVar5 * 4 + 0x30) = (int)uVar18;
            if (uVar18 != uVar23) {
              lVar25 = 0x40;
              uVar5 = 0;
              uVar20 = 0;
LAB_0010bd1c:
              bVar27 = lVar25 != 0;
              lVar25 = lVar25 + -1;
              if ((uVar18 - uVar23 <= uVar17 - 0xf) && (bVar27)) {
                uVar14 = uVar5;
                if (uVar20 < uVar5) {
                  uVar14 = uVar20;
                }
                puVar13 = ringbuffer + uVar14 + (uVar23 & ringbuffer_mask);
                uVar15 = 0x80 - uVar14;
                if (7 < uVar15) {
                  uVar21 = uVar15 & 0xfffffffffffffff8;
                  lVar10 = 0;
                  uVar22 = 0;
LAB_0010bd85:
                  if (*(ulong *)(puVar13 + uVar22 * 8) ==
                      *(ulong *)(ringbuffer + uVar22 * 8 + uVar14 + uVar19)) goto code_r0x0010bd92;
                  uVar22 = *(ulong *)(ringbuffer + uVar22 * 8 + uVar14 + uVar19) ^
                           *(ulong *)(puVar13 + uVar22 * 8);
                  uVar15 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  uVar22 = (uVar15 >> 3 & 0x1fffffff) - lVar10;
                  goto LAB_0010bdca;
                }
                uVar21 = 0;
                goto LAB_0010be46;
              }
            }
LAB_0010bcd0:
            uVar2 = *(undefined4 *)(hasher + 0x80030);
            *(undefined4 *)(hasher + local_19a8 * 4 + 0x80038) = uVar2;
LAB_0010bce4:
            *(undefined4 *)(hasher + local_19b0 * 4 + 0x80038) = uVar2;
            uVar18 = uVar18 + 1;
          } while (uVar18 < uVar24);
        }
        lVar25 = uVar4 - 1;
        uVar17 = sVar7 + 4;
        do {
          sVar7 = uVar17 - 3;
          if (num_bytes <= uVar17) break;
          EvaluateNode(position,sVar7,max_backward_limit,(size_t)dist_cache,(int *)&local_b58,
                       (ZopfliCostModel *)&queue,(StartPosQueue *)nodes,nodes_00);
          uVar17 = uVar17 + 1;
          lVar25 = lVar25 + -1;
        } while (lVar25 != 0);
      }
      uVar17 = sVar7 + 4;
      sVar7 = sVar7 + 1;
    } while (uVar17 < num_bytes);
  }
  m_00 = local_1908;
  BrotliFree(local_1908,local_b58.literal_costs_);
  BrotliFree(m_00,local_b58.cost_dist_);
  sVar7 = ComputeShortestPathFromNodes(num_bytes,nodes);
  return sVar7;
code_r0x0010b603:
  uVar14 = uVar14 + 1;
  lVar25 = lVar25 + -8;
  uVar15 = uVar24 & 0xfffffffffffffff8;
  puVar26 = puVar13 + (uVar24 & 0xfffffffffffffff8);
  if (uVar24 >> 3 == uVar14) goto LAB_0010b676;
  goto LAB_0010b5f6;
code_r0x0010bfe2:
  uVar15 = uVar15 + 1;
  lVar10 = lVar10 + -8;
  if (uVar14 >> 3 == uVar15) goto code_r0x0010bfee;
  goto LAB_0010bfd4;
code_r0x0010bfee:
  puVar13 = puVar13 + -lVar10;
LAB_0010c0fd:
  uVar14 = uVar14 & 7;
  uVar15 = uVar22;
  if (uVar14 != 0) {
    uVar21 = uVar22 | uVar14;
    do {
      uVar15 = uVar22;
      if (ringbuffer[uVar22 + uVar20 + uVar4] != *puVar13) break;
      puVar13 = puVar13 + 1;
      uVar22 = uVar22 + 1;
      uVar14 = uVar14 - 1;
      uVar15 = uVar21;
    } while (uVar14 != 0);
  }
LAB_0010c01e:
  uVar15 = uVar15 + uVar20;
  if (local_19b8 == (BackwardMatch *)0x0) {
    local_19b8 = (BackwardMatch *)0x0;
  }
  else if (uVar23 < uVar15) {
    local_19b8->distance = (uint32_t)(uVar17 - uVar19);
    local_19b8->length_and_code = (int)uVar15 << 5;
    local_19b8 = local_19b8 + 1;
    uVar23 = uVar15;
  }
  if (uVar5 <= uVar15) {
    if (uVar24 < 0x80) goto LAB_0010b742;
    *(undefined4 *)(hasher + local_1958 * 4 + 0x80038) =
         *(undefined4 *)(hasher + (uVar19 & uVar18) * 8 + 0x80038);
    uVar2 = *(undefined4 *)(hasher + (uVar19 & uVar18) * 8 + 0x8003c);
    goto LAB_0010b732;
  }
  if (ringbuffer[uVar15 + (uVar19 & ringbuffer_mask)] < ringbuffer[uVar15 + uVar4]) {
    if (0x7f < uVar24) {
      *(int *)(hasher + local_1958 * 4 + 0x80038) = (int)uVar19;
    }
    lVar10 = (uVar19 & uVar18) * 2 + 1;
    local_1998 = uVar15;
    local_1958 = lVar10;
  }
  else {
    if (0x7f < uVar24) {
      *(int *)(hasher + local_1930 * 4 + 0x80038) = (int)uVar19;
    }
    lVar10 = (uVar19 & uVar18) * 2;
    local_1968 = uVar15;
    local_1930 = lVar10;
  }
  uVar19 = (ulong)*(uint *)(hasher + lVar10 * 4 + 0x80038);
  if (uVar17 == uVar19) goto LAB_0010b715;
  goto LAB_0010bf66;
code_r0x0010bb4e:
  uVar21 = uVar21 + 1;
  lVar10 = lVar10 + -8;
  if (uVar15 >> 3 == uVar21) goto code_r0x0010bb5a;
  goto LAB_0010bb41;
code_r0x0010bb5a:
  puVar13 = puVar13 + -lVar10;
LAB_0010bc09:
  uVar15 = uVar15 & 7;
  uVar21 = uVar22;
  if (uVar15 != 0) {
    uVar11 = uVar22 | uVar15;
    do {
      uVar21 = uVar22;
      if (ringbuffer[uVar22 + uVar14 + uVar19] != *puVar13) break;
      puVar13 = puVar13 + 1;
      uVar22 = uVar22 + 1;
      uVar15 = uVar15 - 1;
      uVar21 = uVar11;
    } while (uVar15 != 0);
  }
LAB_0010bb8b:
  uVar21 = uVar21 + uVar14;
  if (0x7f < uVar21) {
    *(undefined4 *)(hasher + local_19a8 * 4 + 0x80038) =
         *(undefined4 *)(hasher + (uVar20 & uVar17) * 8 + 0x80038);
    uVar2 = *(undefined4 *)(hasher + (uVar20 & uVar17) * 8 + 0x8003c);
    goto LAB_0010ba9b;
  }
  uVar14 = (uVar20 & uVar17) * 2;
  if (ringbuffer[uVar21 + (uVar20 & ringbuffer_mask)] < ringbuffer[uVar21 + uVar19]) {
    *(int *)(hasher + local_19a8 * 4 + 0x80038) = (int)uVar20;
    uVar14 = uVar14 | 1;
    local_19a8 = uVar14;
    local_1988 = uVar21;
  }
  else {
    *(int *)(hasher + local_19b0 * 4 + 0x80038) = (int)uVar20;
    uVar23 = uVar21;
    local_19b0 = uVar14;
  }
  uVar20 = (ulong)*(uint *)(hasher + uVar14 * 4 + 0x80038);
  if (uVar5 == uVar20) goto LAB_0010ba87;
  goto LAB_0010bad6;
code_r0x0010bd92:
  uVar22 = uVar22 + 1;
  lVar10 = lVar10 + -8;
  if (uVar15 >> 3 == uVar22) goto code_r0x0010bd9e;
  goto LAB_0010bd85;
code_r0x0010bd9e:
  puVar13 = puVar13 + -lVar10;
LAB_0010be46:
  uVar15 = uVar15 & 7;
  uVar22 = uVar21;
  if (uVar15 != 0) {
    uVar11 = uVar21 | uVar15;
    do {
      uVar22 = uVar21;
      if (ringbuffer[uVar21 + uVar14 + uVar19] != *puVar13) break;
      puVar13 = puVar13 + 1;
      uVar21 = uVar21 + 1;
      uVar15 = uVar15 - 1;
      uVar22 = uVar11;
    } while (uVar15 != 0);
  }
LAB_0010bdca:
  uVar22 = uVar22 + uVar14;
  if (0x7f < uVar22) {
    *(undefined4 *)(hasher + local_19a8 * 4 + 0x80038) =
         *(undefined4 *)(hasher + (uVar23 & uVar17) * 8 + 0x80038);
    uVar2 = *(undefined4 *)(hasher + (uVar23 & uVar17) * 8 + 0x8003c);
    goto LAB_0010bce4;
  }
  uVar14 = (uVar23 & uVar17) * 2;
  if (ringbuffer[uVar22 + (uVar23 & ringbuffer_mask)] < ringbuffer[uVar22 + uVar19]) {
    *(int *)(hasher + local_19a8 * 4 + 0x80038) = (int)uVar23;
    uVar14 = uVar14 | 1;
    uVar20 = uVar22;
    local_19a8 = uVar14;
  }
  else {
    *(int *)(hasher + local_19b0 * 4 + 0x80038) = (int)uVar23;
    uVar5 = uVar22;
    local_19b0 = uVar14;
  }
  uVar23 = (ulong)*(uint *)(hasher + uVar14 * 4 + 0x80038);
  if (uVar18 == uVar23) goto LAB_0010bcd0;
  goto LAB_0010bd1c;
}

Assistant:

size_t BrotliZopfliComputeShortestPath(MemoryManager* m,
    size_t num_bytes, size_t position, const uint8_t* ringbuffer,
    size_t ringbuffer_mask, const BrotliEncoderParams* params,
    const size_t max_backward_limit, const int* dist_cache, HasherHandle hasher,
    ZopfliNode* nodes) {
  const size_t max_zopfli_len = MaxZopfliLen(params);
  ZopfliCostModel model;
  StartPosQueue queue;
  BackwardMatch matches[2 * (MAX_NUM_MATCHES_H10 + 64)];
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  size_t gap = 0;
  size_t lz_matches_offset = 0;
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      &model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t skip;
    size_t num_matches = FindAllMatchesH10(hasher, &params->dictionary,
        ringbuffer, ringbuffer_mask, pos, num_bytes - i, max_distance, gap,
        params, &matches[lz_matches_offset]);
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, &model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(position, i, max_backward_limit, gap, dist_cache, &model,
            &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, &model);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}